

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

bool __thiscall EmmyFacade::PipeConnect(EmmyFacade *this,lua_State *L,string *name,string *err)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *this_01;
  undefined1 local_48 [7];
  bool suc;
  shared_ptr<PipelineClientTransporter> p;
  string *err_local;
  string *name_local;
  lua_State *L_local;
  EmmyFacade *this_local;
  
  Destroy(this);
  this_00 = &p.super___shared_ptr<PipelineClientTransporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  EmmyDebuggerManager::AddDebugger
            ((EmmyDebuggerManager *)this_00,(lua_State *)&this->_emmyDebuggerManager);
  std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)this_00);
  SetReadyHook(this,L);
  std::make_shared<PipelineClientTransporter>();
  std::shared_ptr<Transporter>::operator=
            (&this->transporter,(shared_ptr<PipelineClientTransporter> *)local_48);
  this_01 = std::
            __shared_ptr_access<PipelineClientTransporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<PipelineClientTransporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
  bVar1 = PipelineClientTransporter::Connect(this_01,name,err);
  if (bVar1) {
    WaitIDE(this,true,0);
  }
  std::shared_ptr<PipelineClientTransporter>::~shared_ptr
            ((shared_ptr<PipelineClientTransporter> *)local_48);
  return bVar1;
}

Assistant:

bool EmmyFacade::PipeConnect(lua_State *L, const std::string &name, std::string &err) {
	Destroy();

	_emmyDebuggerManager.AddDebugger(L);

	SetReadyHook(L);

	const auto p = std::make_shared<PipelineClientTransporter>();
	transporter = p;
	// p->SetHandler(shared_from_this());
	const auto suc = p->Connect(name, err);
	if (suc) {
		WaitIDE(true);
	}
	return suc;
}